

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int tohex(lua_State *L)

{
  TValue *pTVar1;
  UB UVar2;
  UB UVar3;
  uint uVar4;
  char *pcVar5;
  UB UVar6;
  int iVar7;
  size_t len;
  UB UVar8;
  char *pcVar9;
  char buf [8];
  char acStack_18 [8];
  
  UVar2 = barg(L,1);
  pTVar1 = L->base + 1;
  if ((pTVar1 == &luaO_nilobject_ || L->top <= pTVar1) || (L->base[1].tt == -1)) {
    UVar3 = 8;
    pcVar5 = "0123456789abcdef";
  }
  else {
    UVar3 = barg(L,2);
    pcVar5 = "0123456789abcdef";
    if ((int)UVar3 < 0) {
      pcVar5 = "0123456789ABCDEF";
    }
    if (UVar3 == 0) {
      UVar3 = 0;
      goto LAB_0011460b;
    }
  }
  UVar6 = -UVar3;
  if (0 < (int)UVar3) {
    UVar6 = UVar3;
  }
  UVar8 = 8;
  if ((int)UVar6 < 8) {
    UVar8 = UVar6;
  }
  iVar7 = UVar8 + 1;
  pcVar9 = acStack_18 + (UVar8 - 1);
  do {
    *pcVar9 = pcVar5[UVar2 & 0xf];
    UVar2 = UVar2 >> 4;
    iVar7 = iVar7 + -1;
    pcVar9 = pcVar9 + -1;
  } while (1 < iVar7);
LAB_0011460b:
  uVar4 = -UVar3;
  if (0 < (int)UVar3) {
    uVar4 = UVar3;
  }
  len = 8;
  if (uVar4 < 8) {
    len = (size_t)uVar4;
  }
  lua_pushlstring(L,acStack_18,len);
  return 1;
}

Assistant:

static int tohex(lua_State*L){
UB b=barg(L,1);
int n=lua_isnone(L,2)?8:(int)barg(L,2);
const char*hexdigits="0123456789abcdef";
char buf[8];
int i;
if(n<0){n=-n;hexdigits="0123456789ABCDEF";}
if(n>8)n=8;
for(i=(int)n;--i>=0;){buf[i]=hexdigits[b&15];b>>=4;}
lua_pushlstring(L,buf,(size_t)n);
return 1;
}